

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTest.cpp
# Opt level: O1

int LogTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Log log;
  Trace trace;
  string local_c448;
  string local_c428;
  Log local_c408;
  undefined1 local_c3a8 [50064];
  
  paVar1 = &local_c448.field_2;
  local_c448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c448,"logTest.txt","");
  BuildRelativeOutputPath((string *)local_c3a8,argv,&local_c448);
  Log::Log(&local_c408,(string *)local_c3a8,true);
  pcVar2 = local_c3a8 + 0x10;
  if ((pointer)local_c3a8._0_8_ != pcVar2) {
    operator_delete((void *)local_c3a8._0_8_,local_c3a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c448._M_dataplus._M_p != paVar1) {
    operator_delete(local_c448._M_dataplus._M_p,local_c448.field_2._M_allocated_capacity + 1);
  }
  local_c3a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c3a8,"testing wide string input","");
  Log::LogEntry(&local_c408,(string *)local_c3a8);
  if ((pointer)local_c3a8._0_8_ != pcVar2) {
    operator_delete((void *)local_c3a8._0_8_,local_c3a8._16_8_ + 1);
  }
  Log::LogEntry(&local_c408,(Byte *)"testing Byte input",0x12);
  Trace::Trace((Trace *)local_c3a8);
  local_c428._M_dataplus._M_p = (pointer)&local_c428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c428,"traceTest.txt","");
  BuildRelativeOutputPath(&local_c448,argv,&local_c428);
  Trace::SetLogSettings((Trace *)local_c3a8,&local_c448,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c448._M_dataplus._M_p != paVar1) {
    operator_delete(local_c448._M_dataplus._M_p,local_c448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c428._M_dataplus._M_p != &local_c428.field_2) {
    operator_delete(local_c428._M_dataplus._M_p,local_c428.field_2._M_allocated_capacity + 1);
  }
  Trace::TraceToLog((Trace *)local_c3a8,"Tracing number %d %d",10,0x14);
  Trace::TraceToLog((Trace *)local_c3a8,"Tracing some other items %s 0x%x","hello",0x14);
  Trace::~Trace((Trace *)local_c3a8);
  Log::~Log(&local_c408);
  return 0;
}

Assistant:

int LogTest(int argc, char* argv[])
{
	Log log(BuildRelativeOutputPath(argv,"logTest.txt"),true);

	log.LogEntry("testing wide string input");

	const char* aString = "testing Byte input";

	log.LogEntry((const Byte*)aString,strlen(aString));


	Trace trace;

	trace.SetLogSettings(BuildRelativeOutputPath(argv,"traceTest.txt"),true,true);
	trace.TraceToLog("Tracing number %d %d",10,20);
	trace.TraceToLog("Tracing some other items %s 0x%x","hello",20);

	return 0;
}